

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

bool __thiscall
ExecutionEngine::doesMethodExist
          (ExecutionEngine *this,ClassRuntime *classRuntime,string *name,string *descriptor)

{
  u2 index;
  bool bVar1;
  __type _Var2;
  ClassFile *pCVar3;
  char *pcVar4;
  undefined7 extraout_var;
  long lVar5;
  ulong uVar6;
  allocator local_85;
  undefined4 local_84;
  string *local_80;
  string *local_78;
  string methodName;
  string methodDesc;
  
  local_80 = descriptor;
  local_78 = name;
  pCVar3 = ClassRuntime::getClassFile(classRuntime);
  lVar5 = 4;
  uVar6 = 0xffffffffffffffff;
  local_84 = 0;
  do {
    uVar6 = uVar6 + 1;
    if (pCVar3->methods_count <= uVar6) break;
    index = *(u2 *)((long)&pCVar3->methods->access_flags + lVar5);
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,*(u2 *)((long)pCVar3->methods + lVar5 + -2))
    ;
    std::__cxx11::string::string((string *)&methodName,pcVar4,(allocator *)&methodDesc);
    pcVar4 = getFormattedConstant(pCVar3->constant_pool,index);
    std::__cxx11::string::string((string *)&methodDesc,pcVar4,&local_85);
    _Var2 = std::operator==(&methodName,local_78);
    if (_Var2) {
      _Var2 = std::operator==(&methodDesc,local_80);
      if (!_Var2) goto LAB_00118ede;
      local_84 = (undefined4)CONCAT71(extraout_var,1);
      bVar1 = false;
    }
    else {
LAB_00118ede:
      bVar1 = true;
    }
    lVar5 = lVar5 + 0x10;
    std::__cxx11::string::~string((string *)&methodDesc);
    std::__cxx11::string::~string((string *)&methodName);
  } while (bVar1);
  return (bool)((byte)local_84 & 1);
}

Assistant:

bool ExecutionEngine::doesMethodExist(ClassRuntime *classRuntime, string name, string descriptor) {
    ClassFile *classFile = classRuntime->getClassFile();

    bool found = false;
    method_info method;
    for (int i = 0; i < classFile->methods_count; i++) {
        method = classFile->methods[i];
        string methodName = getFormattedConstant(classFile->constant_pool, method.name_index);
        string methodDesc = getFormattedConstant(classFile->constant_pool, method.descriptor_index);

        if (methodName == name && methodDesc == descriptor) {
            found = true;
            break;
        }
    }

    return found;
}